

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

string * utilities::ltrim(string *__return_storage_ptr__,string *s)

{
  long lVar1;
  allocator local_11;
  
  lVar1 = std::__cxx11::string::find_first_not_of((string *)s,0x12f4c8);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_11);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ltrim(const std::string& s)
    {
        size_t start = s.find_first_not_of(WHITESPACE);
        return (start == std::string::npos) ? "" : s.substr(start);
    }